

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O3

private_dispatcher_handle_t __thiscall
so_5::disp::one_thread::create_private_disp
          (one_thread *this,environment_t *env,string *data_sources_name_base,disp_params_t *params)

{
  atomic_refcounted_t *paVar1;
  _Manager_type p_Var2;
  real_private_dispatcher_t *this_00;
  disp_params_t local_58;
  
  this_00 = (real_private_dispatcher_t *)operator_new(0x18);
  local_58.super_work_thread_activity_tracking_flag_mixin_t<so_5::disp::one_thread::disp_params_t>.
  m_flag = (params->
           super_work_thread_activity_tracking_flag_mixin_t<so_5::disp::one_thread::disp_params_t>).
           m_flag;
  local_58.m_queue_params.m_lock_factory.super__Function_base._M_functor._M_unused._M_object =
       (void *)0x0;
  local_58.m_queue_params.m_lock_factory.super__Function_base._M_functor._8_8_ = 0;
  local_58.m_queue_params.m_lock_factory.super__Function_base._M_manager = (_Manager_type)0x0;
  local_58.m_queue_params.m_lock_factory._M_invoker =
       (params->m_queue_params).m_lock_factory._M_invoker;
  p_Var2 = (params->m_queue_params).m_lock_factory.super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    local_58.m_queue_params.m_lock_factory.super__Function_base._M_functor._M_unused._0_8_ =
         (undefined8)
         *(undefined8 *)&(params->m_queue_params).m_lock_factory.super__Function_base._M_functor;
    local_58.m_queue_params.m_lock_factory.super__Function_base._M_functor._8_8_ =
         *(undefined8 *)
          ((long)&(params->m_queue_params).m_lock_factory.super__Function_base._M_functor + 8);
    (params->m_queue_params).m_lock_factory.super__Function_base._M_manager = (_Manager_type)0x0;
    (params->m_queue_params).m_lock_factory._M_invoker = (_Invoker_type)0x0;
    local_58.m_queue_params.m_lock_factory.super__Function_base._M_manager = p_Var2;
  }
  impl::real_private_dispatcher_t::real_private_dispatcher_t
            (this_00,env,data_sources_name_base,&local_58);
  *(real_private_dispatcher_t **)this = this_00;
  LOCK();
  paVar1 = &(this_00->super_private_dispatcher_t).super_atomic_refcounted_t;
  (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i =
       (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i + 1;
  UNLOCK();
  if (local_58.m_queue_params.m_lock_factory.super__Function_base._M_manager != (_Manager_type)0x0)
  {
    (*local_58.m_queue_params.m_lock_factory.super__Function_base._M_manager)
              ((_Any_data *)&local_58.m_queue_params,(_Any_data *)&local_58.m_queue_params,
               __destroy_functor);
  }
  return (private_dispatcher_handle_t)(private_dispatcher_t *)this;
}

Assistant:

SO_5_FUNC private_dispatcher_handle_t
create_private_disp(
	environment_t & env,
	const std::string & data_sources_name_base,
	disp_params_t params )
{
	return private_dispatcher_handle_t(
			new impl::real_private_dispatcher_t(
					env,
					data_sources_name_base,
					std::move(params) ) );
}